

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnReturnExpr(BinaryReaderInterp *this)

{
  Result RVar1;
  undefined8 in_RAX;
  Enum EVar2;
  Index keep_count;
  Index drop_count;
  undefined8 local_18;
  
  local_18 = in_RAX;
  RVar1 = GetReturnDropKeepCount(this,(Index *)((long)&local_18 + 4),(Index *)&local_18);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    RVar1 = SharedValidator::OnReturn
                      (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc)
    ;
    if (RVar1.enum_ != Error) {
      Istream::EmitDropKeep(this->istream_,local_18._4_4_,(u32)local_18);
      Istream::Emit(this->istream_,Return);
      EVar2 = Ok;
    }
  }
  return (Result)EVar2;
}

Assistant:

Result BinaryReaderInterp::OnReturnExpr() {
  Index drop_count, keep_count;
  CHECK_RESULT(GetReturnDropKeepCount(&drop_count, &keep_count));
  CHECK_RESULT(validator_.OnReturn(loc));
  istream_.EmitDropKeep(drop_count, keep_count);
  istream_.Emit(Opcode::Return);
  return Result::Ok;
}